

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_index(FuncState *fs,ExpDesc *t,ExpDesc *e)

{
  double dVar1;
  uint uVar2;
  BCReg BVar3;
  double *in_RDX;
  long in_RSI;
  BCReg idx;
  int32_t k;
  lua_Number n;
  FuncState *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  *(undefined4 *)(in_RSI + 8) = 9;
  if (*(int *)(in_RDX + 1) == 4) {
    dVar1 = *in_RDX;
    uVar2 = (uint)dVar1;
    if (uVar2 == (uVar2 & 0xff)) {
      if ((dVar1 == (double)(int)uVar2) && (!NAN(dVar1) && !NAN((double)(int)uVar2))) {
        *(uint *)(in_RSI + 4) = uVar2 + 0x100;
        return;
      }
    }
  }
  else if ((*(int *)(in_RDX + 1) == 3) &&
          (BVar3 = const_str((FuncState *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             (ExpDesc *)in_stack_ffffffffffffffc8), BVar3 < 0x100)) {
    *(BCReg *)(in_RSI + 4) = BVar3 ^ 0xffffffff;
    return;
  }
  BVar3 = expr_toanyreg(in_stack_ffffffffffffffc8,(ExpDesc *)0x152862);
  *(BCReg *)(in_RSI + 4) = BVar3;
  return;
}

Assistant:

static void expr_index(FuncState *fs, ExpDesc *t, ExpDesc *e)
{
  /* Already called: expr_toval(fs, e). */
  t->k = VINDEXED;
  if (expr_isnumk(e)) {
#if LJ_DUALNUM
    if (tvisint(expr_numtv(e))) {
      int32_t k = intV(expr_numtv(e));
      if (checku8(k)) {
	t->u.s.aux = BCMAX_C+1+(uint32_t)k;  /* 256..511: const byte key */
	return;
      }
    }
#else
    lua_Number n = expr_numberV(e);
    int32_t k = lj_num2int(n);
    if (checku8(k) && n == (lua_Number)k) {
      t->u.s.aux = BCMAX_C+1+(uint32_t)k;  /* 256..511: const byte key */
      return;
    }
#endif
  } else if (expr_isstrk(e)) {
    BCReg idx = const_str(fs, e);
    if (idx <= BCMAX_C) {
      t->u.s.aux = ~idx;  /* -256..-1: const string key */
      return;
    }
  }
  t->u.s.aux = expr_toanyreg(fs, e);  /* 0..255: register */
}